

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

sunrealtype N_VMin_Serial(N_Vector x)

{
  long lVar1;
  sunrealtype *psVar2;
  long lVar3;
  double dVar4;
  sunrealtype sVar5;
  
  lVar1 = *x->content;
  psVar2 = *(sunrealtype **)((long)x->content + 0x10);
  sVar5 = *psVar2;
  if (1 < lVar1) {
    lVar3 = 1;
    do {
      dVar4 = psVar2[lVar3];
      if (sVar5 <= dVar4) {
        dVar4 = sVar5;
      }
      lVar3 = lVar3 + 1;
      sVar5 = dVar4;
    } while (lVar1 != lVar3);
    return dVar4;
  }
  return sVar5;
}

Assistant:

sunrealtype N_VMin_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype min, *xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  min = xd[0];

  for (i = 1; i < N; i++)
  {
    if (xd[i] < min) { min = xd[i]; }
  }

  return (min);
}